

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

bool __thiscall
Imath_3_2::Matrix33<double>::equalWithAbsError(Matrix33<double> *this,Matrix33<double> *m,double e)

{
  double dVar1;
  double dVar2;
  int i;
  ulong uVar3;
  int j;
  long lVar4;
  
  for (uVar3 = 0; uVar3 != 3; uVar3 = uVar3 + 1) {
    lVar4 = 0;
    while (lVar4 != 3) {
      dVar1 = (*(double (*) [3])*(double (*) [3])this)[lVar4];
      dVar2 = (*(double (*) [3])*(double (*) [3])m)[lVar4];
      lVar4 = lVar4 + 1;
      if (e < (double)(~-(ulong)(dVar2 < dVar1) & (ulong)(dVar2 - dVar1) |
                      (ulong)(dVar1 - dVar2) & -(ulong)(dVar2 < dVar1))) goto LAB_00142bc9;
    }
    m = (Matrix33<double> *)((long)m + 0x18);
    this = (Matrix33<double> *)((long)this + 0x18);
  }
LAB_00142bc9:
  return 2 < uVar3;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Matrix33<T>::equalWithAbsError (const Matrix33<T>& m, T e) const IMATH_NOEXCEPT
{
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            if (!IMATH_INTERNAL_NAMESPACE::equalWithAbsError (
                    (*this)[i][j], m[i][j], e))
                return false;

    return true;
}